

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

void __thiscall FIX::FieldMap::replaceGroup(FieldMap *this,int num,int tag,FieldMap *group)

{
  iterator iVar1;
  int local_1c;
  
  local_1c = tag;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
          ::find(&(this->m_groups)._M_t,&local_1c);
  if ((0 < num &&
       (_Rb_tree_header *)iVar1._M_node != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header) &&
     ((ulong)(uint)num <=
      (ulong)((long)iVar1._M_node[1]._M_left - (long)iVar1._M_node[1]._M_parent >> 3))) {
    operator=(*(FieldMap **)((long)iVar1._M_node[1]._M_parent + (ulong)(uint)num * 8 + -8),group);
  }
  return;
}

Assistant:

void FieldMap::replaceGroup(int num, int tag, const FieldMap &group) {
  Groups::const_iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }
  if (num <= 0) {
    return;
  }
  if (tagWithGroups->second.size() < static_cast<unsigned>(num)) {
    return;
  }
  *(*(tagWithGroups->second.begin() + (num - 1))) = group;
}